

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

int ED25519_verify(uint8_t *message,size_t message_len,uint8_t *signature,uint8_t *public_key)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  size_t i;
  long lVar5;
  uint uVar6;
  byte bVar7;
  bool bVar8;
  uint8_t scopy [32];
  uint8_t rcopy [32];
  ge_p2 R;
  ge_p1p1 t_1;
  fe trT;
  fe trZ;
  fe trY;
  ge_p3 u;
  fe_loose t;
  ge_p3 A;
  uint8_t h [64];
  char bslide [256];
  char aslide [256];
  uint8_t rcheck [32];
  ge_cached local_608;
  ge_cached local_568;
  ge_cached local_4c8;
  ge_cached local_428;
  ge_cached local_388;
  ge_cached local_2e8;
  ge_cached local_248;
  ge_p3 local_1a8;
  SHA512_CTX hash_ctx;
  
  if ((signature[0x3f] < 0x20) && (iVar3 = x25519_ge_frombytes_vartime(&A,public_key), iVar3 != 0))
  {
    fe_neg(&t,&A.X);
    fe_carry(&A.X,&t);
    fe_neg(&t,&A.T);
    fe_carry(&A.T,&t);
    rcopy._0_8_ = *(undefined8 *)signature;
    rcopy._8_8_ = *(undefined8 *)(signature + 8);
    rcopy._16_8_ = *(undefined8 *)(signature + 0x10);
    rcopy._24_8_ = *(undefined8 *)(signature + 0x18);
    scopy._16_8_ = *(undefined8 *)(signature + 0x30);
    scopy._24_8_ = *(undefined8 *)(signature + 0x38);
    scopy._0_8_ = *(undefined8 *)(signature + 0x20);
    scopy._8_8_ = *(undefined8 *)(signature + 0x28);
    lVar5 = 3;
    do {
      uVar1 = ED25519_verify::kOrder[lVar5];
      uVar2 = *(ulong *)(scopy + lVar5 * 8);
      if (uVar2 >= uVar1 && uVar2 != uVar1) {
        return 0;
      }
      if (uVar2 < uVar1) {
        SHA512_Init((SHA512_CTX *)&hash_ctx);
        SHA512_Update((SHA512_CTX *)&hash_ctx,signature,0x20);
        SHA512_Update((SHA512_CTX *)&hash_ctx,public_key,0x20);
        SHA512_Update((SHA512_CTX *)&hash_ctx,message,message_len);
        SHA512_Final(h,(SHA512_CTX *)&hash_ctx);
        x25519_sc_reduce(h);
        slide(aslide,h);
        slide(bslide,scopy);
        x25519_ge_p3_to_cached((ge_cached *)rcheck,&A);
        ge_p3_dbl(&t_1,&A);
        x25519_ge_p1p1_to_p3(&local_1a8,&t_1);
        x25519_ge_add(&t_1,&local_1a8,(ge_cached *)rcheck);
        x25519_ge_p1p1_to_p3(&u,&t_1);
        x25519_ge_p3_to_cached(&local_608,&u);
        x25519_ge_add(&t_1,&local_1a8,&local_608);
        x25519_ge_p1p1_to_p3(&u,&t_1);
        x25519_ge_p3_to_cached(&local_568,&u);
        x25519_ge_add(&t_1,&local_1a8,&local_568);
        x25519_ge_p1p1_to_p3(&u,&t_1);
        x25519_ge_p3_to_cached(&local_4c8,&u);
        x25519_ge_add(&t_1,&local_1a8,&local_4c8);
        x25519_ge_p1p1_to_p3(&u,&t_1);
        x25519_ge_p3_to_cached(&local_428,&u);
        x25519_ge_add(&t_1,&local_1a8,&local_428);
        x25519_ge_p1p1_to_p3(&u,&t_1);
        x25519_ge_p3_to_cached(&local_388,&u);
        x25519_ge_add(&t_1,&local_1a8,&local_388);
        x25519_ge_p1p1_to_p3(&u,&t_1);
        x25519_ge_p3_to_cached(&local_2e8,&u);
        x25519_ge_add(&t_1,&local_1a8,&local_2e8);
        x25519_ge_p1p1_to_p3(&u,&t_1);
        x25519_ge_p3_to_cached(&local_248,&u);
        R.X.v[2] = 0;
        R.X.v[3] = 0;
        R.X.v[0] = 0;
        R.X.v[1] = 0;
        R.X.v[4] = 0;
        R.Y.v[1] = 0;
        R.Y.v[2] = 0;
        R.Y.v[3] = 0;
        R.Y.v[4] = 0;
        R.Y.v[0] = 1;
        R.Z.v[1] = 0;
        R.Z.v[2] = 0;
        R.Z.v[3] = 0;
        R.Z.v[4] = 0;
        R.Z.v[0] = 1;
        for (uVar4 = 0xff;
            ((uVar6 = 0xffffffff, -1 < (int)uVar4 && (uVar6 = uVar4, aslide[uVar4] == '\0')) &&
            (bslide[uVar4] == '\0')); uVar4 = uVar4 - 1) {
        }
        for (; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
          ge_p2_dbl(&t_1,&R);
          bVar7 = aslide[uVar6];
          if ((char)bVar7 < '\x01') {
            if ((char)bVar7 < '\0') {
              x25519_ge_p1p1_to_p3(&u,&t_1);
              x25519_ge_sub(&t_1,&u,(ge_cached *)(rcheck + (ulong)((byte)-bVar7 >> 1) * 0xa0));
            }
          }
          else {
            x25519_ge_p1p1_to_p3(&u,&t_1);
            x25519_ge_add(&t_1,&u,(ge_cached *)(rcheck + (ulong)(bVar7 >> 1) * 0xa0));
          }
          bVar7 = bslide[uVar6];
          if ((char)bVar7 < '\x01') {
            if ((char)bVar7 < '\0') {
              x25519_ge_p1p1_to_p3(&u,&t_1);
              bVar7 = (byte)-bVar7 >> 1;
              fe_add(&t_1.X,&u.Y,&u.X);
              fe_sub(&t_1.Y,&u.Y,&u.X);
              fe_mul_impl(trZ.v,(fe_limb_t *)&t_1,Bi[bVar7].yminusx.v);
              fe_mul_impl(trY.v,t_1.Y.v,(fe_limb_t *)(Bi + bVar7));
              fe_mul_impl(trT.v,Bi[bVar7].xy2d.v,u.T.v);
              fe_add(&t_1.T,&u.Z,&u.Z);
              fe_sub(&t_1.X,&trZ,&trY);
              fe_add(&t_1.Y,&trZ,&trY);
              fe_carry(&trZ,&t_1.T);
              fe_sub(&t_1.Z,&trZ,&trT);
              fe_add(&t_1.T,&trZ,&trT);
            }
          }
          else {
            x25519_ge_p1p1_to_p3(&u,&t_1);
            ge_madd(&t_1,&u,Bi + (bVar7 >> 1));
          }
          x25519_ge_p1p1_to_p2(&R,&t_1);
        }
        x25519_ge_tobytes(rcheck,&R);
        iVar3 = CRYPTO_memcmp(rcheck,rcopy,0x20);
        return (uint)(iVar3 == 0);
      }
      bVar8 = lVar5 != 0;
      lVar5 = lVar5 + -1;
    } while (bVar8);
  }
  return 0;
}

Assistant:

int ED25519_verify(const uint8_t *message, size_t message_len,
                   const uint8_t signature[64], const uint8_t public_key[32]) {
  ge_p3 A;
  if ((signature[63] & 224) != 0 ||
      !x25519_ge_frombytes_vartime(&A, public_key)) {
    return 0;
  }

  fe_loose t;
  fe_neg(&t, &A.X);
  fe_carry(&A.X, &t);
  fe_neg(&t, &A.T);
  fe_carry(&A.T, &t);

  uint8_t pkcopy[32];
  OPENSSL_memcpy(pkcopy, public_key, 32);
  uint8_t rcopy[32];
  OPENSSL_memcpy(rcopy, signature, 32);
  uint8_t scopy[32];
  OPENSSL_memcpy(scopy, signature + 32, 32);

  // https://tools.ietf.org/html/rfc8032#section-5.1.7 requires that s be in
  // the range [0, order) in order to prevent signature malleability.

  // kOrder is the order of Curve25519 in little-endian form.
  static const uint64_t kOrder[4] = {
      UINT64_C(0x5812631a5cf5d3ed),
      UINT64_C(0x14def9dea2f79cd6),
      0,
      UINT64_C(0x1000000000000000),
  };
  for (size_t i = 3;; i--) {
    uint64_t word = CRYPTO_load_u64_le(scopy + i * 8);
    if (word > kOrder[i]) {
      return 0;
    } else if (word < kOrder[i]) {
      break;
    } else if (i == 0) {
      return 0;
    }
  }

  SHA512_CTX hash_ctx;
  SHA512_Init(&hash_ctx);
  SHA512_Update(&hash_ctx, signature, 32);
  SHA512_Update(&hash_ctx, public_key, 32);
  SHA512_Update(&hash_ctx, message, message_len);
  uint8_t h[SHA512_DIGEST_LENGTH];
  SHA512_Final(h, &hash_ctx);

  x25519_sc_reduce(h);

  ge_p2 R;
  ge_double_scalarmult_vartime(&R, h, &A, scopy);

  uint8_t rcheck[32];
  x25519_ge_tobytes(rcheck, &R);

  return CRYPTO_memcmp(rcheck, rcopy, sizeof(rcheck)) == 0;
}